

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int yy_find_shift_action(yyParser *pParser,uchar iLookAhead)

{
  byte iLookAhead_00;
  bool bVar1;
  uint uVar2;
  ushort *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)pParser->yystack[pParser->yyidx].stateno;
  if (uVar6 < 0x1a1) {
    iVar4 = (int)yy_shift_ofst[uVar6];
    if (iVar4 != -0x46) {
      uVar2 = (uint)iLookAhead;
      uVar5 = iVar4 + (uint)iLookAhead;
      if ((uVar5 < 0x61c) && (yy_lookahead[uVar5] == iLookAhead)) {
        puVar3 = yy_action + uVar5;
        goto LAB_001494fa;
      }
      if (iLookAhead == '\0') goto LAB_001494ef;
      if (iLookAhead < 0x43) {
        iLookAhead_00 = ""[iLookAhead];
        uVar2 = (uint)iLookAhead_00;
        if (iLookAhead_00 == 0) goto LAB_001494c4;
        uVar2 = yy_find_shift_action(pParser,iLookAhead_00);
LAB_001494e7:
        bVar1 = false;
      }
      else {
LAB_001494c4:
        bVar1 = true;
        if (-0x44 < yy_shift_ofst[uVar6]) {
          uVar2 = 0x17bb10;
          if (yy_lookahead[iVar4 + 0x43U] == 'C') {
            uVar2 = (uint)yy_action[iVar4 + 0x43U];
            goto LAB_001494e7;
          }
        }
      }
      if (!bVar1) {
        return uVar2;
      }
    }
  }
LAB_001494ef:
  puVar3 = yy_default + uVar6;
LAB_001494fa:
  return (uint)*puVar3;
}

Assistant:

static int yy_find_shift_action(
  yyParser *pParser,        /* The parser */
  YYCODETYPE iLookAhead     /* The look-ahead token */
){
  int i;
  int stateno = pParser->yystack[pParser->yyidx].stateno;
 
  if( stateno>YY_SHIFT_COUNT
   || (i = yy_shift_ofst[stateno])==YY_SHIFT_USE_DFLT ){
    return yy_default[stateno];
  }
  assert( iLookAhead!=YYNOCODE );
  i += iLookAhead;
  if( i<0 || i>=YY_ACTTAB_COUNT || yy_lookahead[i]!=iLookAhead ){
    if( iLookAhead>0 ){
#ifdef YYFALLBACK
      YYCODETYPE iFallback;            /* Fallback token */
      if( iLookAhead<sizeof(yyFallback)/sizeof(yyFallback[0])
             && (iFallback = yyFallback[iLookAhead])!=0 ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE, "%sFALLBACK %s => %s\n",
             yyTracePrompt, yyTokenName[iLookAhead], yyTokenName[iFallback]);
        }
#endif
        return yy_find_shift_action(pParser, iFallback);
      }
#endif
#ifdef YYWILDCARD
      {
        int j = i - iLookAhead + YYWILDCARD;
        if( 
#if YY_SHIFT_MIN+YYWILDCARD<0
          j>=0 &&
#endif
#if YY_SHIFT_MAX+YYWILDCARD>=YY_ACTTAB_COUNT
          j<YY_ACTTAB_COUNT &&
#endif
          yy_lookahead[j]==YYWILDCARD
        ){
#ifndef NDEBUG
          if( yyTraceFILE ){
            fprintf(yyTraceFILE, "%sWILDCARD %s => %s\n",
               yyTracePrompt, yyTokenName[iLookAhead], yyTokenName[YYWILDCARD]);
          }
#endif /* NDEBUG */
          return yy_action[j];
        }
      }
#endif /* YYWILDCARD */
    }
    return yy_default[stateno];
  }else{
    return yy_action[i];
  }
}